

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

int __thiscall CLayerGroup::SwapLayers(CLayerGroup *this,int Index0,int Index1)

{
  int iVar1;
  CLayer **ppCVar2;
  CLayer *pCVar3;
  
  if (-1 < Index0) {
    iVar1 = (this->m_lLayers).num_elements;
    if ((-1 < Index1 && Index0 < iVar1) && (Index0 != Index1 && Index1 < iVar1)) {
      this->m_pMap->m_Modified = true;
      ppCVar2 = (this->m_lLayers).list;
      pCVar3 = ppCVar2[(uint)Index0];
      ppCVar2[(uint)Index0] = ppCVar2[(uint)Index1];
      ppCVar2[(uint)Index1] = pCVar3;
      return Index1;
    }
  }
  return Index0;
}

Assistant:

int CLayerGroup::SwapLayers(int Index0, int Index1)
{
	if(Index0 < 0 || Index0 >= m_lLayers.size()) return Index0;
	if(Index1 < 0 || Index1 >= m_lLayers.size()) return Index0;
	if(Index0 == Index1) return Index0;
	m_pMap->m_Modified = true;
	std::swap(m_lLayers[Index0], m_lLayers[Index1]);
	return Index1;
}